

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

void Token_delete(Token *token)

{
  if (token != (Token *)0x0) {
    if (token->line != (GherkinLine_conflict *)0x0) {
      GherkinLine_delete((GherkinLine *)token->line);
    }
    if (token->matched_text != (wchar_t *)0x0) {
      free(token->matched_text);
    }
    if (token->matched_items != (Items *)0x0) {
      Token_delete_matched_items(token->matched_items);
    }
    free(token);
    return;
  }
  return;
}

Assistant:

void Token_delete(Token* token) {
    if (!token) {
        return;
    }
    if (token->line)
        GherkinLine_delete(token->line);
    if (token->matched_text)
        free((void*)token->matched_text);
    if (token->matched_items) {
        Token_delete_matched_items(token->matched_items);
    }
    free((void*)token);
}